

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

bool __thiscall QWidget::isAncestorOf(QWidget *this,QWidget *child)

{
  bool bVar1;
  QWidget *in_RSI;
  QWidget *in_RDI;
  QWidget *local_18;
  
  local_18 = in_RSI;
  while( true ) {
    if (local_18 == (QWidget *)0x0) {
      return false;
    }
    if (local_18 == in_RDI) break;
    bVar1 = isWindow(in_RDI);
    if (bVar1) {
      return false;
    }
    local_18 = parentWidget((QWidget *)0x372b28);
  }
  return true;
}

Assistant:

bool QWidget::isAncestorOf(const QWidget *child) const
{
    while (child) {
        if (child == this)
            return true;
        if (child->isWindow())
            return false;
        child = child->parentWidget();
    }
    return false;
}